

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int resolveOrderByTermToExprList(Parse *pParse,Select *pSelect,Expr *pE)

{
  u8 uVar1;
  sqlite3 *psVar2;
  int iVar3;
  u8 savedSuppErr;
  int rc;
  sqlite3 *db;
  NameContext nc;
  ExprList *pEList;
  int i;
  Expr *pE_local;
  Select *pSelect_local;
  Parse *pParse_local;
  
  nc.pWinSelect = (Select *)pSelect->pEList;
  memset(&db,0,0x38);
  nc.pParse = (Parse *)pSelect->pSrc;
  nc.pSrcList = (SrcList *)nc.pWinSelect;
  nc.nRef = 0x81;
  nc.pNext._4_4_ = 0;
  psVar2 = pParse->db;
  uVar1 = psVar2->suppressErr;
  psVar2->suppressErr = '\x01';
  db = (sqlite3 *)pParse;
  iVar3 = sqlite3ResolveExprNames((NameContext *)&db,pE);
  psVar2->suppressErr = uVar1;
  if (iVar3 == 0) {
    for (pEList._4_4_ = 0; pEList._4_4_ < *(int *)&(nc.pWinSelect)->pEList;
        pEList._4_4_ = pEList._4_4_ + 1) {
      iVar3 = sqlite3ExprCompare((Parse *)0x0,
                                 *(Expr **)((nc.pWinSelect)->addrOpenEphm +
                                           (long)pEList._4_4_ * 8 + -5),pE,-1);
      if (iVar3 < 2) {
        return pEList._4_4_ + 1;
      }
    }
  }
  return 0;
}

Assistant:

static int resolveOrderByTermToExprList(
  Parse *pParse,     /* Parsing context for error messages */
  Select *pSelect,   /* The SELECT statement with the ORDER BY clause */
  Expr *pE           /* The specific ORDER BY term */
){
  int i;             /* Loop counter */
  ExprList *pEList;  /* The columns of the result set */
  NameContext nc;    /* Name context for resolving pE */
  sqlite3 *db;       /* Database connection */
  int rc;            /* Return code from subprocedures */
  u8 savedSuppErr;   /* Saved value of db->suppressErr */

  assert( sqlite3ExprIsInteger(pE, &i)==0 );
  pEList = pSelect->pEList;

  /* Resolve all names in the ORDER BY term expression
  */
  memset(&nc, 0, sizeof(nc));
  nc.pParse = pParse;
  nc.pSrcList = pSelect->pSrc;
  nc.uNC.pEList = pEList;
  nc.ncFlags = NC_AllowAgg|NC_UEList;
  nc.nErr = 0;
  db = pParse->db;
  savedSuppErr = db->suppressErr;
  db->suppressErr = 1;
  rc = sqlite3ResolveExprNames(&nc, pE);
  db->suppressErr = savedSuppErr;
  if( rc ) return 0;

  /* Try to match the ORDER BY expression against an expression
  ** in the result set.  Return an 1-based index of the matching
  ** result-set entry.
  */
  for(i=0; i<pEList->nExpr; i++){
    if( sqlite3ExprCompare(0, pEList->a[i].pExpr, pE, -1)<2 ){
      return i+1;
    }
  }

  /* If no match, return 0. */
  return 0;
}